

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

int qGetColumnType(QString *tpName)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QString typeName;
  QString *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar5;
  QString *in_stack_ffffffffffffff38;
  int local_a4;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLower(in_stack_ffffffffffffff28);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_ffffffffffffff38,
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT15(in_stack_ffffffffffffff35,
                                        CONCAT14(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                )))));
  bVar1 = operator==(in_stack_ffffffffffffff38,
                     (QLatin1StringView *)
                     CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,
                                       CONCAT15(in_stack_ffffffffffffff35,
                                                CONCAT14(in_stack_ffffffffffffff34,
                                                         in_stack_ffffffffffffff30)))));
  uVar5 = true;
  if (!bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_ffffffffffffff38,
               CONCAT17(1,CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT15(in_stack_ffffffffffffff35,
                                            CONCAT14(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30)))));
    uVar5 = operator==(in_stack_ffffffffffffff38,
                       (QLatin1StringView *)
                       CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff36,
                                               CONCAT15(in_stack_ffffffffffffff35,
                                                        CONCAT14(in_stack_ffffffffffffff34,
                                                                 in_stack_ffffffffffffff30)))));
  }
  if ((bool)uVar5 == false) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_ffffffffffffff38,
               (ulong)CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT15(in_stack_ffffffffffffff35,
                                        CONCAT14(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ))));
    bVar1 = operator==(in_stack_ffffffffffffff38,
                       (QLatin1StringView *)
                       CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff36,
                                               CONCAT15(in_stack_ffffffffffffff35,
                                                        CONCAT14(in_stack_ffffffffffffff34,
                                                                 in_stack_ffffffffffffff30)))));
    bVar4 = 1;
    if (!bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_ffffffffffffff38,
                 CONCAT17(uVar5,CONCAT16(1,CONCAT15(in_stack_ffffffffffffff35,
                                                    CONCAT14(in_stack_ffffffffffffff34,
                                                             in_stack_ffffffffffffff30)))));
      bVar1 = operator==(in_stack_ffffffffffffff38,
                         (QLatin1StringView *)
                         CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff35,
                                                                CONCAT14(in_stack_ffffffffffffff34,
                                                                         in_stack_ffffffffffffff30))
                                                )));
      bVar4 = 1;
      if (!bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_ffffffffffffff38,
                   CONCAT17(uVar5,CONCAT16(1,CONCAT15(in_stack_ffffffffffffff35,
                                                      CONCAT14(in_stack_ffffffffffffff34,
                                                               in_stack_ffffffffffffff30)))));
        bVar1 = operator==(in_stack_ffffffffffffff38,
                           (QLatin1StringView *)
                           CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff35,
                                                                  CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))));
        bVar4 = 1;
        if (!bVar1) {
          QVar2 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_ffffffffffffff38,
                             CONCAT17(uVar5,CONCAT16(1,CONCAT15(in_stack_ffffffffffffff35,
                                                                CONCAT14(in_stack_ffffffffffffff34,
                                                                         in_stack_ffffffffffffff30))
                                                    )));
          in_stack_ffffffffffffff38 = (QString *)QVar2.m_size;
          bVar4 = QString::startsWith((QLatin1String *)&local_20,(CaseSensitivity)QVar2.m_size);
        }
      }
    }
    if ((bVar4 & 1) == 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_ffffffffffffff38,
                 CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff35,
                                                        CONCAT14(in_stack_ffffffffffffff34,
                                                                 in_stack_ffffffffffffff30)))));
      bVar1 = operator==(in_stack_ffffffffffffff38,
                         (QLatin1StringView *)
                         CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff35,
                                                                CONCAT14(in_stack_ffffffffffffff34,
                                                                         in_stack_ffffffffffffff30))
                                                )));
      if (bVar1) {
        local_a4 = 0xc;
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_ffffffffffffff38,
                   CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff35,
                                                          CONCAT14(in_stack_ffffffffffffff34,
                                                                   in_stack_ffffffffffffff30)))));
        bVar1 = operator==(in_stack_ffffffffffffff38,
                           (QLatin1StringView *)
                           CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff35,
                                                                  CONCAT14(in_stack_ffffffffffffff34
                                                                           ,
                                                  in_stack_ffffffffffffff30)))));
        uVar3 = true;
        if (!bVar1) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_ffffffffffffff38,
                     CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(1,CONCAT14(in_stack_ffffffffffffff34,
                                                                       in_stack_ffffffffffffff30))))
                    );
          uVar3 = operator==(in_stack_ffffffffffffff38,
                             (QLatin1StringView *)
                             CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30)))));
        }
        if ((bool)uVar3 == false) {
          local_a4 = 10;
        }
        else {
          local_a4 = 1;
        }
      }
    }
    else {
      local_a4 = 6;
    }
  }
  else {
    local_a4 = 2;
  }
  QString::~QString((QString *)0x11456c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a4;
  }
  __stack_chk_fail();
}

Assistant:

static int qGetColumnType(const QString &tpName)
{
    const QString typeName = tpName.toLower();

    if (typeName == "integer"_L1 || typeName == "int"_L1)
        return QMetaType::Int;
    if (typeName == "double"_L1
        || typeName == "float"_L1
        || typeName == "real"_L1
        || typeName.startsWith("numeric"_L1))
        return QMetaType::Double;
    if (typeName == "blob"_L1)
        return QMetaType::QByteArray;
    if (typeName == "boolean"_L1 || typeName == "bool"_L1)
        return QMetaType::Bool;
    return QMetaType::QString;
}